

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O3

void FLog::mUserLog(time_t dateTime,string *userName,int line,string *function,string *file,
                   string *text)

{
  pointer pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  pthread_t pVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  undefined8 uVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  string *psVar14;
  size_type *psVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  string __str;
  string temp;
  string __str_1;
  string timeTemp;
  string threadIdStr;
  mutex locker;
  ostringstream sstream;
  ulong *local_618;
  long local_610;
  ulong local_608;
  long lStack_600;
  ulong *local_5f8;
  long local_5f0;
  ulong local_5e8 [2];
  long *local_5d8;
  undefined8 local_5d0;
  long local_5c8;
  undefined8 uStack_5c0;
  string *local_5b8;
  long *local_5b0;
  long local_5a8;
  long local_5a0;
  long lStack_598;
  time_t local_590;
  string local_588;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  string *local_3c8;
  long local_3c0;
  string local_3b8;
  string local_398;
  long local_378;
  long lStack_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  string local_328;
  string local_308;
  long *local_2e8;
  long local_2d8 [2];
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_590 = dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pVar5 = pthread_self();
  if (pVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"thread::id of a non-executing thread",0x24);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  std::__cxx11::stringbuf::str();
  if (logLevel == none) goto LAB_0010520d;
  cVar2 = (char)(line >> 0x1f);
  if (printAll != false || printUser != false) {
    pcVar6 = ctime(&local_590);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,pcVar6,(allocator<char> *)local_268);
    std::__cxx11::string::replace
              ((ulong)&local_368,local_368._M_string_length - 1,(char *)0x1,0x10e15d);
    std::operator+(&local_288," [DateTime: ",&local_368);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_568 = &local_558;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_558 = *plVar12;
      lStack_550 = plVar7[3];
    }
    else {
      local_558 = *plVar12;
      local_568 = (long *)*plVar7;
    }
    local_560 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_568);
    local_548 = &local_538;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_538 = *plVar12;
      lStack_530 = plVar7[3];
    }
    else {
      local_538 = *plVar12;
      local_548 = (long *)*plVar7;
    }
    local_540 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_548);
    local_618 = &local_608;
    puVar13 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar13) {
      local_608 = *puVar13;
      lStack_600 = plVar7[3];
    }
    else {
      local_608 = *puVar13;
      local_618 = (ulong *)*plVar7;
    }
    local_610 = plVar7[1];
    *plVar7 = (long)puVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uVar18 = -line;
    if (0 < line) {
      uVar18 = line;
    }
    uVar17 = 1;
    if (9 < uVar18) {
      uVar16 = (ulong)uVar18;
      uVar3 = 4;
      do {
        uVar17 = uVar3;
        uVar11 = (uint)uVar16;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00104443;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00104443;
        }
        if (uVar11 < 10000) goto LAB_00104443;
        uVar16 = uVar16 / 10000;
        uVar3 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00104443:
    local_5f8 = local_5e8;
    local_5b8 = file;
    std::__cxx11::string::_M_construct((ulong)&local_5f8,(char)uVar17 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)line >> 0x1f) + (long)local_5f8),uVar17,uVar18);
    psVar14 = local_5b8;
    uVar16 = 0xf;
    if (local_618 != &local_608) {
      uVar16 = local_608;
    }
    if (uVar16 < (ulong)(local_5f0 + local_610)) {
      uVar16 = 0xf;
      if (local_5f8 != local_5e8) {
        uVar16 = local_5e8[0];
      }
      if (uVar16 < (ulong)(local_5f0 + local_610)) goto LAB_001044d1;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_5f8,0,(char *)0x0,(ulong)local_618);
    }
    else {
LAB_001044d1:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_5f8);
    }
    local_5d8 = &local_5c8;
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_5c8 = *plVar7;
      uStack_5c0 = puVar8[3];
    }
    else {
      local_5c8 = *plVar7;
      local_5d8 = (long *)*puVar8;
    }
    local_5d0 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_5d8);
    local_528 = &local_518;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_518 = *plVar12;
      lStack_510 = plVar7[3];
    }
    else {
      local_518 = *plVar12;
      local_528 = (long *)*plVar7;
    }
    local_520 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_528);
    local_508 = &local_4f8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_4f8 = *plVar12;
      lStack_4f0 = plVar7[3];
    }
    else {
      local_4f8 = *plVar12;
      local_508 = (long *)*plVar7;
    }
    local_500 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_508,(ulong)(function->_M_dataplus)._M_p);
    local_4e8 = &local_4d8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_4d8 = *plVar12;
      lStack_4d0 = plVar7[3];
    }
    else {
      local_4d8 = *plVar12;
      local_4e8 = (long *)*plVar7;
    }
    local_4e0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4e8);
    local_4c8 = &local_4b8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_4b8 = *plVar12;
      lStack_4b0 = plVar7[3];
    }
    else {
      local_4b8 = *plVar12;
      local_4c8 = (long *)*plVar7;
    }
    local_4c0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
    local_4a8 = &local_498;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_498 = *plVar12;
      lStack_490 = plVar7[3];
    }
    else {
      local_498 = *plVar12;
      local_4a8 = (long *)*plVar7;
    }
    local_4a0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_4a8,(ulong)local_2e8);
    local_488 = &local_478;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_478 = *plVar12;
      lStack_470 = plVar7[3];
    }
    else {
      local_478 = *plVar12;
      local_488 = (long *)*plVar7;
    }
    local_480 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
    local_468 = &local_458;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_458 = *plVar12;
      lStack_450 = plVar7[3];
    }
    else {
      local_458 = *plVar12;
      local_468 = (long *)*plVar7;
    }
    local_460 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_468);
    local_448 = &local_438;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_438 = *plVar12;
      lStack_430 = plVar7[3];
    }
    else {
      local_438 = *plVar12;
      local_448 = (long *)*plVar7;
    }
    local_440 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_448,(ulong)(psVar14->_M_dataplus)._M_p);
    local_428 = &local_418;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_418 = *plVar12;
      lStack_410 = plVar7[3];
    }
    else {
      local_418 = *plVar12;
      local_428 = (long *)*plVar7;
    }
    local_420 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_428);
    psVar14 = (string *)(plVar7 + 2);
    if ((string *)*plVar7 == psVar14) {
      local_3b8._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_3b8._M_string_length = plVar7[3];
      local_3c8 = &local_3b8;
    }
    else {
      local_3b8._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_3c8 = (string *)*plVar7;
    }
    local_3c0 = plVar7[1];
    *plVar7 = (long)psVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
    local_408 = &local_3f8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_3f8 = *plVar12;
      lStack_3f0 = plVar7[3];
    }
    else {
      local_3f8 = *plVar12;
      local_408 = (long *)*plVar7;
    }
    local_400 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_408,(ulong)(userName->_M_dataplus)._M_p);
    local_3e8 = &local_3d8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_3d8 = *plVar12;
      lStack_3d0 = plVar7[3];
    }
    else {
      local_3d8 = *plVar12;
      local_3e8 = (long *)*plVar7;
    }
    local_3e0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    psVar14 = (string *)(plVar7 + 2);
    if ((string *)*plVar7 == psVar14) {
      local_398._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_398._M_string_length = plVar7[3];
      local_3b8.field_2._M_allocated_capacity = (size_type)&local_398;
    }
    else {
      local_398._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_3b8.field_2._M_allocated_capacity = (size_type)(string *)*plVar7;
    }
    local_3b8.field_2._8_8_ = plVar7[1];
    *plVar7 = (long)psVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_3b8.field_2._M_local_buf);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_378 = *plVar12;
      lStack_370 = plVar7[3];
      local_398.field_2._M_allocated_capacity = (size_type)&local_378;
    }
    else {
      local_378 = *plVar12;
      local_398.field_2._M_allocated_capacity = (size_type)(long *)*plVar7;
    }
    local_398.field_2._8_8_ = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               (local_398.field_2._M_local_buf,(ulong)(text->_M_dataplus)._M_p);
    psVar15 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar15) {
      local_268._16_8_ = *psVar15;
      local_268._24_8_ = plVar7[3];
      local_268._0_8_ = local_268 + 0x10;
    }
    else {
      local_268._16_8_ = *psVar15;
      local_268._0_8_ = (size_type *)*plVar7;
    }
    local_268._8_8_ = plVar7[1];
    *plVar7 = (long)psVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_268);
    local_5b0 = &local_5a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_5a0 = *plVar12;
      lStack_598 = plVar7[3];
    }
    else {
      local_5a0 = *plVar12;
      local_5b0 = (long *)*plVar7;
    }
    local_5a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if ((long *)local_398.field_2._M_allocated_capacity != &local_378) {
      operator_delete((void *)local_398.field_2._M_allocated_capacity,local_378 + 1);
    }
    if ((string *)local_3b8.field_2._M_allocated_capacity != &local_398) {
      operator_delete((void *)local_3b8.field_2._M_allocated_capacity,
                      (ulong)(local_398._M_dataplus._M_p + 1));
    }
    file = local_5b8;
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,(ulong)(local_3b8._M_dataplus._M_p + 1));
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418 + 1);
    }
    if (local_448 != &local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if (local_488 != &local_478) {
      operator_delete(local_488,local_478 + 1);
    }
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,local_498 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    if (local_4e8 != &local_4d8) {
      operator_delete(local_4e8,local_4d8 + 1);
    }
    if (local_508 != &local_4f8) {
      operator_delete(local_508,local_4f8 + 1);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,local_518 + 1);
    }
    if (local_5d8 != &local_5c8) {
      operator_delete(local_5d8,local_5c8 + 1);
    }
    if (local_5f8 != local_5e8) {
      operator_delete(local_5f8,local_5e8[0] + 1);
    }
    if (local_618 != &local_608) {
      operator_delete(local_618,local_608 + 1);
    }
    if (local_548 != &local_538) {
      operator_delete(local_548,local_538 + 1);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568,local_558 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    local_268._16_8_ = 0;
    local_268._24_8_ = (__pthread_internal_list *)0x0;
    local_268._0_8_ = (ulong *)0x0;
    local_268._8_8_ = 0;
    local_268._32_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_268);
    if (iVar4 != 0) {
      uVar10 = std::__throw_system_error(iVar4);
      if ((ulong *)local_268._0_8_ != &local_608) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      if ((long *)local_398.field_2._M_allocated_capacity != &local_558) {
        operator_delete((void *)local_398.field_2._M_allocated_capacity,local_378 + 1);
      }
      if ((string *)local_3b8.field_2._M_allocated_capacity != file) {
        operator_delete((void *)local_3b8.field_2._M_allocated_capacity,
                        (ulong)(local_398._M_dataplus._M_p + 1));
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_408 != &local_3f8) {
        operator_delete(local_408,local_3f8 + 1);
      }
      if (local_3c8 != text) {
        operator_delete(local_3c8,(ulong)(local_3b8._M_dataplus._M_p + 1));
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418 + 1);
      }
      if (local_448 != &local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458 + 1);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488,local_478 + 1);
      }
      if (local_4a8 != &local_498) {
        operator_delete(local_4a8,local_498 + 1);
      }
      if (local_4c8 != &local_4b8) {
        operator_delete(local_4c8,local_4b8 + 1);
      }
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,local_4d8 + 1);
      }
      if (local_508 != &local_4f8) {
        operator_delete(local_508,local_4f8 + 1);
      }
      if (local_528 != &local_518) {
        operator_delete(local_528,local_518 + 1);
      }
      if (local_5d8 != &local_5c8) {
        operator_delete(local_5d8,local_5c8 + 1);
      }
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618,local_608 + 1);
      }
      if (local_548 != &local_538) {
        operator_delete(local_548,local_538 + 1);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568,local_558 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (local_2e8 != local_2d8) {
        operator_delete(local_2e8,local_2d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar10);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::clog,(char *)local_5b0,local_5a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)local_268);
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0,local_5a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar6 = ctime(&local_590);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,pcVar6,(allocator<char> *)&local_368);
  uVar18 = -line;
  if (0 < line) {
    uVar18 = line;
  }
  uVar17 = 1;
  if (9 < uVar18) {
    uVar16 = (ulong)uVar18;
    uVar3 = 4;
    do {
      uVar17 = uVar3;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00104f6d;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00104f6d;
      }
      if (uVar11 < 10000) goto LAB_00104f6d;
      uVar16 = uVar16 / 10000;
      uVar3 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00104f6d:
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_588,(char)uVar17 - cVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_588._M_dataplus._M_p + ((uint)line >> 0x1f),uVar17,uVar18);
  pcVar1 = (file->_M_dataplus)._M_p;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,pcVar1,pcVar1 + file->_M_string_length);
  pcVar1 = (text->_M_dataplus)._M_p;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,pcVar1,pcVar1 + text->_M_string_length);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"user","");
  pcVar1 = (userName->_M_dataplus)._M_p;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + userName->_M_string_length);
  FONQRI::UserLog::UserLog
            ((UserLog *)local_268,&local_2a8,&local_588,&local_308,&local_328,&local_348,&local_2c8)
  ;
  std::vector<FONQRI::UserLog,_std::allocator<FONQRI::UserLog>_>::emplace_back<FONQRI::UserLog>
            (&userLogList,(UserLog *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != &local_218) {
    operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._32_8_ != &local_238) {
    operator_delete((void *)local_268._32_8_,local_238._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
LAB_0010520d:
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FLog::mUserLog(std::time_t dateTime, std::string userName, int line,
			std::string function, std::string file, std::string text)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel != FLog::none) {
		if (FLog::printUser | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " +
			" [Type: User    ] " + " [Line: " +
			std::to_string(line) + " ] " + " [Function: " +
			function + " ] " + " [Thread Id: " + threadIdStr +
			" ] " + " [File: " + file + " ] " + " [User: " +
			userName + " ] " + " [MSG: " + text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::userLogList.push_back(FONQRI::UserLog(
		std::string(std::ctime(&dateTime)), std::to_string(line), file,
		text, "user", userName));
		if (FLog::userLogList.size() >= FLog::userLogCounts) {
			// NOTE you can save save userLogList  to database
		}
	}
}